

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testTimestamp(void)

{
  uint64_t timestamp;
  int iVar1;
  C *pCVar2;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  Time local_44;
  
  iVar1 = 0x14;
  do {
    timestamp = axl::sys::getTimestamp();
    axl::sys::Time::setTimestampImpl(&local_44,timestamp,true,0);
    local_88.m_length._0_1_ = 0;
    local_88.m_length._1_7_ = 0;
    local_88.m_isNullTerminated = false;
    local_88.m_p = (C *)0x0;
    local_88.m_hdr._0_1_ = 0;
    local_88.m_hdr._1_7_ = 0;
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (&local_88,(BufHdr *)0x0);
    local_88.m_p = "%h:%m:%s.%l.%c";
    local_88.m_length._0_1_ = 0xe;
    local_88.m_length._1_7_ = 0;
    local_88.m_isNullTerminated = true;
    axl::sys::Time::format((String *)&local_68,&local_44,&local_88);
    pCVar2 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_68.m_length != 0) {
      pCVar2 = local_68.m_p;
    }
    printf("%s: %llu\n",pCVar2,timestamp);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_88);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void
testTimestamp() {
	for (int i = 0; i < 20; i++) {
		uint64_t t1 = sys::getTimestamp();
		printf("%s: %llu\n", sys::Time(t1).format("%h:%m:%s.%l.%c").sz(), t1);
	}
}